

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnATM.cpp
# Opt level: O2

void __thiscall
VariationalBayesEstimatorOnATM::updateBeta
          (VariationalBayesEstimatorOnATM *this,BetaUpdateManner manner)

{
  int k_1;
  ulong uVar1;
  int v_1;
  ulong uVar2;
  int k;
  ulong uVar3;
  int k_2;
  long lVar4;
  type tVar5;
  type tVar6;
  double dVar7;
  double commonBeta;
  double local_48;
  double local_40;
  double local_30;
  
  if (manner == SYMMETRY) {
    local_48 = 0.0;
    dVar7 = 0.0;
    for (uVar3 = 0; uVar3 < this->_K; uVar3 = uVar3 + 1) {
      for (uVar2 = 0; uVar2 < this->_V; uVar2 = uVar2 + 1) {
        tVar5 = boost::math::digamma<double>
                          (*(double *)
                            (*(long *)&(this->_nkv).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + uVar2 * 8) +
                           (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar2]);
        tVar6 = boost::math::digamma<double>
                          ((this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar2]);
        local_48 = local_48 +
                   (tVar5 - tVar6) *
                   (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar2];
      }
      tVar5 = boost::math::digamma<double>
                        ((this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar3] + this->_betaSum);
      tVar6 = boost::math::digamma<double>(this->_betaSum);
      dVar7 = dVar7 + (tVar5 - tVar6);
    }
    local_30 = (local_48 / dVar7) / (double)this->_V;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->_beta,(ulong)this->_V,&local_30);
  }
  else {
    local_40 = 0.0;
    for (uVar3 = 0; uVar2 = (ulong)this->_K, uVar3 < uVar2; uVar3 = uVar3 + 1) {
      tVar5 = boost::math::digamma<double>
                        ((this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar3] + this->_betaSum);
      tVar6 = boost::math::digamma<double>(this->_betaSum);
      local_40 = local_40 + (tVar5 - tVar6);
    }
    for (uVar3 = 0; uVar3 < this->_V; uVar3 = uVar3 + 1) {
      dVar7 = 0.0;
      lVar4 = 0;
      for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 1) {
        tVar5 = boost::math::digamma<double>
                          (*(double *)
                            (*(long *)((long)&(((this->_nkv).
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data + lVar4) + uVar3 * 8)
                           + (this->_beta).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar3]);
        tVar6 = boost::math::digamma<double>
                          ((this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar3]);
        dVar7 = dVar7 + (tVar5 - tVar6) *
                        (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3];
        uVar2 = (ulong)this->_K;
        lVar4 = lVar4 + 0x18;
      }
      (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = dVar7 / local_40;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  return;
}

Assistant:

void VariationalBayesEstimatorOnATM::updateBeta(BetaUpdateManner manner){//{{{
    if(manner == SYMMETRY){
        double numerator=0;
        double denominator=0;
        for(int k=0;k<_K;k++){
            for(int v=0;v<_V;v++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v]) - boost::math::digamma(_beta[v]))*_beta[v];
            }
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        double commonBeta = numerator/denominator/_V;
        _beta.assign(_V, commonBeta);
    }else{
        double denominator=0;
        for(int k=0;k<_K;k++){
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        for(int v=0;v<_V;v++){
            double numerator=0;
            for(int k=0;k<_K;k++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v])-boost::math::digamma(_beta[v]))*_beta[v];
            }
            _beta[v] = numerator/denominator;
        }
    }
    _betaTimeSeries.push_back(_beta);
}